

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::ruby::(anonymous_namespace)::RubyEscape_abi_cxx11_
          (string *__return_storage_ptr__,void *this,string_view s)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  AlphaNum local_d8;
  AlphaNum local_a8;
  ulong local_78;
  size_t i;
  undefined1 local_59;
  void *local_58;
  size_t sStack_50;
  undefined1 local_40 [8];
  string c_escaped;
  string_view s_local;
  string *result;
  
  sStack_50 = s._M_len;
  local_58 = this;
  c_escaped.field_2._8_8_ = this;
  absl::lts_20250127::CHexEscape_abi_cxx11_((string *)local_40,(lts_20250127 *)this,s);
  local_59 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::length();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (local_78 = 0; uVar3 = local_78, uVar1 = std::__cxx11::string::length(), uVar3 < uVar1;
      local_78 = local_78 + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
    if (((*pcVar2 == '#') &&
        (uVar3 = local_78 + 1, uVar1 = std::__cxx11::string::length(), uVar3 < uVar1)) &&
       ((pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_40), *pcVar2 == '{' ||
        ((pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_40), *pcVar2 == '$' ||
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_40), *pcVar2 == '@')))))) {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_a8,"\\");
      absl::lts_20250127::StrAppend(__return_storage_ptr__,&local_a8);
    }
    std::__cxx11::string::substr((ulong)&local_f8,(ulong)local_40);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_d8,&local_f8);
    absl::lts_20250127::StrAppend(__return_storage_ptr__,&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  local_59 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string RubyEscape(absl::string_view s) {
  std::string c_escaped = absl::CHexEscape(s);
  std::string result;
  result.reserve(c_escaped.length());
  for (size_t i = 0; i < c_escaped.length(); ++i) {
    if (c_escaped[i] == '#' &&
        (i + 1 < c_escaped.length() &&
         (c_escaped[i + 1] == '{' || c_escaped[i + 1] == '$' ||
          c_escaped[i + 1] == '@'))) {
      absl::StrAppend(&result, "\\");
    }
    absl::StrAppend(&result, c_escaped.substr(i, 1));
  }
  return result;
}